

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info.cc
# Opt level: O1

void __thiscall bloaty::dwarf::DIEReader::SkipChildren(DIEReader *this,CU *cu,Abbrev *abbrev)

{
  int iVar1;
  pointer pAVar2;
  char *pcVar3;
  size_t sVar4;
  Abbrev *pAVar5;
  int iVar6;
  pointer pAVar7;
  AttrValue AStack_48;
  
  if (abbrev->has_child == true) {
    iVar1 = this->depth_;
    sVar4 = (this->remaining_)._M_len;
    if (sVar4 != 0) {
      pcVar3 = (this->remaining_)._M_str;
      iVar6 = iVar1;
      do {
        iVar6 = iVar6 + -1;
        sVar4 = sVar4 - 1;
        if (*pcVar3 != '\0') break;
        (this->remaining_)._M_str = pcVar3 + 1;
        (this->remaining_)._M_len = sVar4;
        this->depth_ = iVar6;
        pcVar3 = pcVar3 + 1;
      } while (sVar4 != 0);
    }
    iVar6 = this->depth_;
    while ((iVar1 <= iVar6 && (pAVar5 = ReadCode(this,cu), pAVar5 != (Abbrev *)0x0))) {
      pAVar2 = (pAVar5->attr).
               super__Vector_base<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pAVar7 = (pAVar5->attr).
                    super__Vector_base<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
                    ._M_impl.super__Vector_impl_data._M_start; pAVar7 != pAVar2; pAVar7 = pAVar7 + 1
          ) {
        AttrValue::ParseAttr(&AStack_48,cu,pAVar7->form,&this->remaining_);
      }
      sVar4 = (this->remaining_)._M_len;
      if (sVar4 != 0) {
        iVar6 = this->depth_;
        pcVar3 = (this->remaining_)._M_str;
        do {
          iVar6 = iVar6 + -1;
          sVar4 = sVar4 - 1;
          if (*pcVar3 != '\0') break;
          (this->remaining_)._M_str = pcVar3 + 1;
          (this->remaining_)._M_len = sVar4;
          this->depth_ = iVar6;
          pcVar3 = pcVar3 + 1;
        } while (sVar4 != 0);
      }
      iVar6 = this->depth_;
    }
  }
  return;
}

Assistant:

void DIEReader::SkipChildren(const CU& cu, const AbbrevTable::Abbrev* abbrev) {
  if (!abbrev->has_child) {
    return;
  }

  int target_depth = depth_ - 1;
  SkipNullEntries();
  while (depth_ > target_depth) {
    // TODO(haberman): use DW_AT_sibling to optimize skipping when it is
    // available.
    abbrev = ReadCode(cu);
    if (!abbrev) {
      return;
    }
    ReadAttributes(cu, abbrev, [](uint16_t, dwarf::AttrValue) {});
    SkipNullEntries();
  }
}